

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_fkhash_nlm.hpp
# Opt level: O2

void __thiscall
poplar::compact_fkhash_nlm<int,_32UL>::append_dummy(compact_fkhash_nlm<int,_32UL> *this)

{
  ulong uVar1;
  
  uVar1 = this->size_;
  this->size_ = uVar1 + 1;
  if ((uVar1 & 0x1f) == 0 && 0x1f < uVar1) {
    release_buf_(this);
  }
  vbyte::append(&this->chunk_buf_,0);
  return;
}

Assistant:

void append_dummy() {
        auto [chunk_id, pos_in_chunk] = decompose_value<ChunkSize>(size_++);
        if (chunk_id != 0 && pos_in_chunk == 0) {
            release_buf_();
        }

        vbyte::append(chunk_buf_, 0);
    }